

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderConstExprTests.cpp
# Opt level: O2

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *
deqp::gls::ShaderConstExpr::createTests
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          TestContext *testContext,RenderContext *renderContext,ContextInfo *contextInfo,
          TestParams *cases,int numCases,GLSLVersion version,TestShaderStage testStage)

{
  DataType dataType;
  pointer pPVar1;
  mapped_type *pmVar2;
  TestParams *pTVar3;
  char *pcVar4;
  ShaderLibraryCase *pSVar5;
  char *__rhs;
  ulong uVar6;
  long lVar7;
  DataType dataType_00;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  TestContext *local_2d0;
  RenderContext *local_2c8;
  ContextInfo *local_2c0;
  ulong local_2b8;
  long local_2b0;
  char *local_2a8;
  string local_2a0 [32];
  ulong local_280;
  DataType local_274;
  TestParams *local_270;
  undefined8 *local_268;
  long local_260;
  string mapped;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expressionTemplateParams;
  ShaderCaseSpecification local_208;
  char *local_178;
  ulong local_170;
  ulong local_168;
  long local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  shaderTemplateParams;
  string typeName;
  string mapped_1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  string caseName;
  StringTemplate expressionTemplate;
  StringTemplate shaderTemplate;
  string expression;
  
  local_2d0 = testContext;
  local_2c8 = renderContext;
  local_2c0 = contextInfo;
  local_270 = cases;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "#version ${GLES_VERSION}\nprecision highp float;\nprecision highp int;\n${DECLARATIONS}\nvoid main()\n{\n\tconst ${CASE_BASE_TYPE} cval = ${CASE_EXPRESSION};\n\tout0 = cval;\n\t${OUTPUT}\n}\n"
             ,(allocator<char> *)&shaderTemplateParams);
  tcu::StringTemplate::StringTemplate(&shaderTemplate,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178 = "100";
  if (version == GLSL_VERSION_300_ES) {
    local_178 = "300 es";
  }
  uVar6 = 0;
  local_170 = (ulong)(uint)numCases;
  if (numCases < 1) {
    local_170 = uVar6;
  }
  while( true ) {
    if (uVar6 == local_170) break;
    shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header;
    shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_280 = (ulong)local_270[uVar6].inType;
    local_2b8 = (ulong)(uint)local_270[uVar6].minComponents;
    local_2b0 = (long)local_270[uVar6].maxComponents;
    dataType = local_270[uVar6].outType;
    local_168 = uVar6;
    shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         shaderTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expression,local_270[uVar6].expression,(allocator<char> *)&local_208);
    local_160 = std::__cxx11::string::find((char *)&expression,0x18fc011);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"GLES_VERSION",(allocator<char> *)&expressionTemplateParams);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderTemplateParams,(key_type *)&local_208);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_208);
    glu::getDataTypeName(dataType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"CASE_BASE_TYPE",(allocator<char> *)&expressionTemplateParams);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderTemplateParams,(key_type *)&local_208);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"DECLARATIONS",(allocator<char> *)&expressionTemplateParams);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderTemplateParams,(key_type *)&local_208);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"OUTPUT",(allocator<char> *)&expressionTemplateParams);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderTemplateParams,(key_type *)&local_208);
    std::__cxx11::string::assign((char *)pmVar2);
    pTVar3 = local_270 + uVar6;
    std::__cxx11::string::~string((string *)&local_208);
    lVar7 = (long)((int)local_2b8 + -1);
    dataType_00 = ((int)local_2b8 + (int)local_280) - TYPE_FLOAT;
    local_268 = (undefined8 *)(&DAT_01e6dc30 + lVar7 * 8);
    while( true ) {
      if (local_2b0 <= lVar7) break;
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header;
      expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_274 = dataType_00;
      local_260 = lVar7;
      expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           expressionTemplateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pcVar4 = glu::getDataTypeName(dataType_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&typeName,pcVar4,(allocator<char> *)&local_208);
      tcu::StringTemplate::StringTemplate(&expressionTemplate,&expression);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,pTVar3->name,(allocator<char> *)&mapped);
      if ((int)local_2b8 == (int)local_2b0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,glcts::fixed_sample_locations_values + 1,&local_2d1);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,"_",&typeName);
      }
      std::operator+(&caseName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"T",(allocator<char> *)&local_2a8);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&expressionTemplateParams,(key_type *)&local_208);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"MT",(allocator<char> *)&local_2a8);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&expressionTemplateParams,(key_type *)&local_208);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      std::__cxx11::string::~string((string *)&local_208);
      tcu::StringTemplate::specialize
                ((string *)&local_2a8,&expressionTemplate,&expressionTemplateParams);
      pcVar4 = (char *)*local_268;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2a8,pcVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mapped,"CASE_EXPRESSION",(allocator<char> *)&mapped_1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&shaderTemplateParams,&mapped);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_208);
      std::__cxx11::string::~string((string *)&mapped);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_2a8);
      tcu::StringTemplate::specialize(&mapped,&shaderTemplate,&shaderTemplateParams);
      if ((testStage & SHADER_VERTEX) != 0) {
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_208._33_8_ = 0;
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        local_208.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.values.uniforms.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.uniforms.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.uniforms.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.values.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.values.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.values.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.values.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.targetVersion = version;
        local_208.caseType = CASETYPE_VERTEX_ONLY;
        local_208.expectResult = EXPECT_PASS;
        std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
        resize(&local_208.programs,1);
        pPVar1 = local_208.programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        glu::VertexSource::VertexSource((VertexSource *)&local_2a8,&mapped);
        glu::ProgramSources::operator<<(&pPVar1->sources,(ShaderSource *)&local_2a8);
        std::__cxx11::string::~string(local_2a0);
        addOutputVar(&local_208.values,dataType,pTVar3->output);
        pSVar5 = (ShaderLibraryCase *)operator_new(0x110);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,&caseName,"_vertex");
        ShaderLibraryCase::ShaderLibraryCase
                  (pSVar5,local_2d0,local_2c8,local_2c0,local_2a8,
                   glcts::fixed_sample_locations_values + 1,&local_208);
        mapped_1._M_dataplus._M_p = (pointer)pSVar5;
        std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                  ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)__return_storage_ptr__,
                   (TestNode **)&mapped_1);
        std::__cxx11::string::~string((string *)&local_2a8);
        glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification(&local_208);
      }
      if ((testStage & SHADER_FRAGMENT) != 0) {
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_208._33_8_ = 0;
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_208.requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        local_208.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.values.uniforms.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.programs.
        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.uniforms.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.uniforms.
        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.values.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.values.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.values.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.values.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.values.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208.targetVersion = version;
        local_208.caseType = CASETYPE_FRAGMENT_ONLY;
        local_208.expectResult = EXPECT_PASS;
        std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
        resize(&local_208.programs,1);
        pPVar1 = local_208.programs.
                 super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        glu::FragmentSource::FragmentSource((FragmentSource *)&local_2a8,&mapped);
        glu::ProgramSources::operator<<(&pPVar1->sources,(ShaderSource *)&local_2a8);
        std::__cxx11::string::~string(local_2a0);
        addOutputVar(&local_208.values,dataType,pTVar3->output);
        pSVar5 = (ShaderLibraryCase *)operator_new(0x110);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,&caseName,"_fragment");
        ShaderLibraryCase::ShaderLibraryCase
                  (pSVar5,local_2d0,local_2c8,local_2c0,local_2a8,
                   glcts::fixed_sample_locations_values + 1,&local_208);
        mapped_1._M_dataplus._M_p = (pointer)pSVar5;
        std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                  ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)__return_storage_ptr__,
                   (TestNode **)&mapped_1);
        std::__cxx11::string::~string((string *)&local_2a8);
        glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification(&local_208);
      }
      std::__cxx11::string::~string((string *)&mapped);
      if ((local_160 != -1) && (0 < local_260)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,pTVar3->name,&local_2d2);
        std::operator+(&mapped_1,&local_158,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,&mapped_1,&typeName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,"_");
        __rhs = glu::getDataTypeName((DataType)local_280);
        std::operator+(&mapped,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_208,__rhs);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&mapped_1);
        std::__cxx11::string::~string((string *)&local_158);
        glu::getDataTypeName((DataType)local_280);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"MT",(allocator<char> *)&local_2a8);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&expressionTemplateParams,(key_type *)&local_208);
        std::__cxx11::string::assign((char *)pmVar2);
        std::__cxx11::string::~string((string *)&local_208);
        tcu::StringTemplate::specialize
                  ((string *)&local_2a8,&expressionTemplate,&expressionTemplateParams);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,pcVar4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&mapped_1,"CASE_EXPRESSION",(allocator<char> *)&local_158);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&shaderTemplateParams,&mapped_1);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_208);
        std::__cxx11::string::~string((string *)&mapped_1);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_2a8);
        tcu::StringTemplate::specialize(&mapped_1,&shaderTemplate,&shaderTemplateParams);
        if ((testStage & SHADER_VERTEX) != 0) {
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_208._33_8_ = 0;
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_208.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.values.uniforms.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.uniforms.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.uniforms.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.values.outputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.values.outputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.values.inputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.values.outputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.inputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.inputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.targetVersion = version;
          local_208.caseType = CASETYPE_VERTEX_ONLY;
          local_208.expectResult = EXPECT_PASS;
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::resize(&local_208.programs,1);
          pPVar1 = local_208.programs.
                   super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          glu::VertexSource::VertexSource((VertexSource *)&local_2a8,&mapped_1);
          glu::ProgramSources::operator<<(&pPVar1->sources,(ShaderSource *)&local_2a8);
          std::__cxx11::string::~string(local_2a0);
          addOutputVar(&local_208.values,dataType,pTVar3->output);
          pSVar5 = (ShaderLibraryCase *)operator_new(0x110);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2a8,&mapped,"_vertex");
          ShaderLibraryCase::ShaderLibraryCase
                    (pSVar5,local_2d0,local_2c8,local_2c0,local_2a8,
                     glcts::fixed_sample_locations_values + 1,&local_208);
          local_158._M_dataplus._M_p = (pointer)pSVar5;
          std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                    ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)__return_storage_ptr__
                     ,(TestNode **)&local_158);
          std::__cxx11::string::~string((string *)&local_2a8);
          glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification(&local_208);
        }
        if ((testStage & SHADER_FRAGMENT) != 0) {
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_208._33_8_ = 0;
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_208.requiredCaps.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_208.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.values.uniforms.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.programs.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.uniforms.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.uniforms.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.values.outputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.values.outputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.values.inputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_208.values.outputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.inputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.values.inputs.
          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.targetVersion = version;
          local_208.caseType = CASETYPE_FRAGMENT_ONLY;
          local_208.expectResult = EXPECT_PASS;
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::resize(&local_208.programs,1);
          pPVar1 = local_208.programs.
                   super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          glu::FragmentSource::FragmentSource((FragmentSource *)&local_2a8,&mapped_1);
          glu::ProgramSources::operator<<(&pPVar1->sources,(ShaderSource *)&local_2a8);
          std::__cxx11::string::~string(local_2a0);
          addOutputVar(&local_208.values,dataType,pTVar3->output);
          pSVar5 = (ShaderLibraryCase *)operator_new(0x110);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2a8,&mapped,"_fragment");
          ShaderLibraryCase::ShaderLibraryCase
                    (pSVar5,local_2d0,local_2c8,local_2c0,local_2a8,
                     glcts::fixed_sample_locations_values + 1,&local_208);
          local_158._M_dataplus._M_p = (pointer)pSVar5;
          std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                    ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)__return_storage_ptr__
                     ,(TestNode **)&local_158);
          std::__cxx11::string::~string((string *)&local_2a8);
          glu::sl::ShaderCaseSpecification::~ShaderCaseSpecification(&local_208);
        }
        std::__cxx11::string::~string((string *)&mapped_1);
        std::__cxx11::string::~string((string *)&mapped);
      }
      std::__cxx11::string::~string((string *)&caseName);
      tcu::StringTemplate::~StringTemplate(&expressionTemplate);
      std::__cxx11::string::~string((string *)&typeName);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&expressionTemplateParams._M_t);
      std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
                (&children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
      lVar7 = local_260 + 1;
      dataType_00 = local_274 + TYPE_FLOAT;
      local_268 = local_268 + 1;
    }
    std::__cxx11::string::~string((string *)&expression);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&shaderTemplateParams._M_t);
    uVar6 = local_168 + 1;
  }
  tcu::StringTemplate::~StringTemplate(&shaderTemplate);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::TestNode*> createTests (tcu::TestContext&			testContext,
										 glu::RenderContext&		renderContext,
										 const glu::ContextInfo&	contextInfo,
										 const TestParams*			cases,
										 int						numCases,
										 glu::GLSLVersion			version,
										 TestShaderStage			testStage)
{
	using std::string;
	using std::vector;
	using gls::ShaderLibraryCase;

	// Needed for autogenerating shader code for increased component counts
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+1 == glu::TYPE_FLOAT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+2 == glu::TYPE_FLOAT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_FLOAT+3 == glu::TYPE_FLOAT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_INT+1 == glu::TYPE_INT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_INT+2 == glu::TYPE_INT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_INT+3 == glu::TYPE_INT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_UINT+1 == glu::TYPE_UINT_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_UINT+2 == glu::TYPE_UINT_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_UINT+3 == glu::TYPE_UINT_VEC4);

	DE_STATIC_ASSERT(glu::TYPE_BOOL+1 == glu::TYPE_BOOL_VEC2);
	DE_STATIC_ASSERT(glu::TYPE_BOOL+2 == glu::TYPE_BOOL_VEC3);
	DE_STATIC_ASSERT(glu::TYPE_BOOL+3 == glu::TYPE_BOOL_VEC4);

	DE_ASSERT(testStage);

	const char* shaderTemplateSrc =
		"#version ${GLES_VERSION}\n"
		"precision highp float;\n"
		"precision highp int;\n"
		"${DECLARATIONS}\n"
		"void main()\n"
		"{\n"
		"	const ${CASE_BASE_TYPE} cval = ${CASE_EXPRESSION};\n"
		"	out0 = cval;\n"
		"	${OUTPUT}\n"
		"}\n";

	const tcu::StringTemplate	shaderTemplate	(shaderTemplateSrc);
	vector<tcu::TestNode*>		ret;

	for (int caseNdx = 0; caseNdx < numCases; caseNdx++)
	{
		std::map<string, string>	shaderTemplateParams;
		const int					minComponents	= cases[caseNdx].minComponents;
		const int					maxComponents	= cases[caseNdx].maxComponents;
		const DataType				inType			= cases[caseNdx].inType;
		const DataType				outType			= cases[caseNdx].outType;
		const string				expression		= cases[caseNdx].expression;
		// Check for presence of func(vec, scalar) style specialization, use as gatekeeper for applying said specialization
		const bool					alwaysScalar	= expression.find("${MT}")!=string::npos;

		shaderTemplateParams["GLES_VERSION"]	= version == glu::GLSL_VERSION_300_ES ? "300 es" : "100";
		shaderTemplateParams["CASE_BASE_TYPE"]	= glu::getDataTypeName(outType);
		shaderTemplateParams["DECLARATIONS"]	= "${DECLARATIONS}";
		shaderTemplateParams["OUTPUT"]			= "${OUTPUT}";

		for (int compCount = minComponents-1; compCount < maxComponents; compCount++)
		{
			vector<tcu::TestNode*>		children;
			std::map<string, string>	expressionTemplateParams;
			string						typeName			= glu::getDataTypeName((glu::DataType)(inType + compCount)); // results in float, vec2, vec3, vec4 progression (same for other primitive types)
			const char*					componentAccess[]	= {"", ".y", ".z", ".w"};
			const tcu::StringTemplate	expressionTemplate	(expression);
			// Add type to case name if we are generating multiple versions
			const string				caseName			= string(cases[caseNdx].name) + (minComponents==maxComponents ? "" : ("_" + typeName));

			// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector
			expressionTemplateParams["T"]			= typeName;
			expressionTemplateParams["MT"]			= typeName;

			shaderTemplateParams["CASE_EXPRESSION"]	= expressionTemplate.specialize(expressionTemplateParams) + componentAccess[compCount]; // Add vector access to expression as needed

			{
				const string mapped = shaderTemplate.specialize(shaderTemplateParams);

				if (testStage & SHADER_VERTEX)
				{
					glu::sl::ShaderCaseSpecification	spec;

					spec.targetVersion	= version;
					spec.expectResult	= glu::sl::EXPECT_PASS;
					spec.caseType		= glu::sl::CASETYPE_VERTEX_ONLY;
					spec.programs.resize(1);

					spec.programs[0].sources << glu::VertexSource(mapped);

					addOutputVar(&spec.values, outType, cases[caseNdx].output);

					ret.push_back(new ShaderLibraryCase(testContext,
														renderContext,
														contextInfo,
														(caseName + "_vertex").c_str(),
														"",
														spec));
				}

				if (testStage & SHADER_FRAGMENT)
				{
					glu::sl::ShaderCaseSpecification	spec;

					spec.targetVersion	= version;
					spec.expectResult	= glu::sl::EXPECT_PASS;
					spec.caseType		= glu::sl::CASETYPE_FRAGMENT_ONLY;
					spec.programs.resize(1);

					spec.programs[0].sources << glu::FragmentSource(mapped);

					addOutputVar(&spec.values, outType, cases[caseNdx].output);

					ret.push_back(new ShaderLibraryCase(testContext,
														renderContext,
														contextInfo,
														(caseName + "_fragment").c_str(),
														"",
														spec));
				}
			}

			// Deal with functions that allways accept one ore more scalar parameters even when others are vectors
			if (alwaysScalar && compCount > 0)
			{
				const string	scalarCaseName	= string(cases[caseNdx].name) + "_" + typeName + "_" + glu::getDataTypeName(inType);

				expressionTemplateParams["MT"] = glu::getDataTypeName(inType);
				shaderTemplateParams["CASE_EXPRESSION"]	= expressionTemplate.specialize(expressionTemplateParams) + componentAccess[compCount];

				{
					const string mapped = shaderTemplate.specialize(shaderTemplateParams);

					if (testStage & SHADER_VERTEX)
					{
						glu::sl::ShaderCaseSpecification	spec;

						spec.targetVersion	= version;
						spec.expectResult	= glu::sl::EXPECT_PASS;
						spec.caseType		= glu::sl::CASETYPE_VERTEX_ONLY;
						spec.programs.resize(1);

						spec.programs[0].sources << glu::VertexSource(mapped);

						addOutputVar(&spec.values, outType, cases[caseNdx].output);

						ret.push_back(new ShaderLibraryCase(testContext,
															renderContext,
															contextInfo,
															(scalarCaseName + "_vertex").c_str(),
															"",
															spec));
					}

					if (testStage & SHADER_FRAGMENT)
					{
						glu::sl::ShaderCaseSpecification	spec;

						spec.targetVersion	= version;
						spec.expectResult	= glu::sl::EXPECT_PASS;
						spec.caseType		= glu::sl::CASETYPE_FRAGMENT_ONLY;
						spec.programs.resize(1);

						spec.programs[0].sources << glu::FragmentSource(mapped);

						addOutputVar(&spec.values, outType, cases[caseNdx].output);

						ret.push_back(new ShaderLibraryCase(testContext,
															renderContext,
															contextInfo,
															(scalarCaseName + "_fragment").c_str(),
															"",
															spec));
					}
				}
			}
		}
	}

	return ret;
}